

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cc
# Opt level: O1

void __thiscall mcc::TypeChecker::Visit(TypeChecker *this,Binary *binary)

{
  element_type *peVar1;
  
  peVar1 = (binary->left_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1->is_const_ = (binary->super_Expr).is_const_;
  ((binary->right_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->is_const_ =
       (binary->super_Expr).is_const_;
  (*peVar1->_vptr_Expr[2])(peVar1,this);
  peVar1 = (binary->right_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_Expr[2])(peVar1,this);
  MatchTypes(this,(binary->left_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (binary->right_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr,false
             ,&binary->super_Expr);
  return;
}

Assistant:

void TypeChecker::Visit(Binary& binary) {
  binary.left_->is_const_ = binary.is_const_;
  binary.right_->is_const_ = binary.is_const_;
  binary.left_->Accept(*this);
  binary.right_->Accept(*this);
  MatchTypes(binary.left_.get(), binary.right_.get(), false, &binary);
}